

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O0

int lib_dlb_fseek(dlb *dp,long pos,int whence)

{
  long local_28;
  long curpos;
  int whence_local;
  long pos_local;
  dlb *dp_local;
  
  if (whence == 1) {
    local_28 = dp->mark + pos;
  }
  else {
    local_28 = pos;
    if (whence == 2) {
      local_28 = dp->size - pos;
    }
  }
  if (local_28 < 0) {
    local_28 = 0;
  }
  if (dp->size < local_28) {
    local_28 = dp->size;
  }
  dp->mark = local_28;
  return 0;
}

Assistant:

static int lib_dlb_fseek(dlb *dp, long pos, int whence)
{
    long curpos;

    switch (whence) {
	case SEEK_CUR:	   curpos = dp->mark + pos;	break;
	case SEEK_END:	   curpos = dp->size - pos;	break;
	default: /* set */ curpos = pos;		break;
    }
    if (curpos < 0) curpos = 0;
    if (curpos > dp->size) curpos = dp->size;

    dp->mark = curpos;
    return 0;
}